

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortByPTypeProcess.cpp
# Opt level: O1

void UpdateNodes(vector<unsigned_int,_std::allocator<unsigned_int>_> *replaceMeshIndex,aiNode *node)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  uint newSize;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  
  uVar3 = node->mNumMeshes;
  if ((ulong)uVar3 != 0) {
    uVar5 = 0;
    uVar4 = 0;
    do {
      lVar6 = 0;
      do {
        uVar4 = uVar4 + ((replaceMeshIndex->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_start
                         [(ulong)(node->mMeshes[uVar5] << 2) + lVar6] != 0xffffffff);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar3);
    if (uVar4 == 0) {
      if (node->mMeshes != (uint *)0x0) {
        operator_delete__(node->mMeshes);
      }
      node->mNumMeshes = 0;
      node->mMeshes = (uint *)0x0;
    }
    else {
      if (uVar3 < uVar4) {
        puVar2 = (uint *)operator_new__((ulong)uVar4 * 4);
      }
      else {
        puVar2 = node->mMeshes;
      }
      uVar3 = node->mNumMeshes;
      if (uVar3 != 0) {
        uVar5 = 0;
        do {
          uVar3 = node->mMeshes[uVar5];
          lVar6 = 0;
          do {
            uVar1 = (replaceMeshIndex->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start[(ulong)(uVar3 << 2) + lVar6];
            if (uVar1 != 0xffffffff) {
              *puVar2 = uVar1;
              puVar2 = puVar2 + 1;
            }
            lVar6 = lVar6 + 1;
          } while (lVar6 != 4);
          uVar5 = uVar5 + 1;
          uVar3 = node->mNumMeshes;
        } while (uVar5 < uVar3);
      }
      if ((uVar3 < uVar4) && (node->mMeshes != (uint *)0x0)) {
        operator_delete__(node->mMeshes);
      }
      node->mNumMeshes = uVar4;
      node->mMeshes = puVar2 + -(ulong)uVar4;
    }
  }
  if (node->mNumChildren != 0) {
    uVar5 = 0;
    do {
      UpdateNodes(replaceMeshIndex,node->mChildren[uVar5]);
      uVar5 = uVar5 + 1;
    } while (uVar5 < node->mNumChildren);
  }
  return;
}

Assistant:

void UpdateNodes(const std::vector<unsigned int>& replaceMeshIndex, aiNode* node)
{
    if (node->mNumMeshes)
    {
        unsigned int newSize = 0;
        for (unsigned int m = 0; m< node->mNumMeshes; ++m)
        {
            unsigned int add = node->mMeshes[m]<<2;
            for (unsigned int i = 0; i < 4;++i)
            {
                if (UINT_MAX != replaceMeshIndex[add+i])++newSize;
            }
        }
        if (!newSize)
        {
            delete[] node->mMeshes;
            node->mNumMeshes = 0;
            node->mMeshes    = NULL;
        }
        else
        {
            // Try to reuse the old array if possible
            unsigned int* newMeshes = (newSize > node->mNumMeshes
                ? new unsigned int[newSize] : node->mMeshes);

            for (unsigned int m = 0; m< node->mNumMeshes; ++m)
            {
                unsigned int add = node->mMeshes[m]<<2;
                for (unsigned int i = 0; i < 4;++i)
                {
                    if (UINT_MAX != replaceMeshIndex[add+i])
                        *newMeshes++ = replaceMeshIndex[add+i];
                }
            }
            if (newSize > node->mNumMeshes)
                delete[] node->mMeshes;

            node->mMeshes = newMeshes-(node->mNumMeshes = newSize);
        }
    }

    // call all subnodes recursively
    for (unsigned int m = 0; m < node->mNumChildren; ++m)
        UpdateNodes(replaceMeshIndex,node->mChildren[m]);
}